

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O1

string * __thiscall MD5::hexdigest_abi_cxx11_(string *__return_storage_ptr__,MD5 *this)

{
  size_t sVar1;
  char *pcVar2;
  int i;
  long lVar3;
  char *pcVar4;
  char buf [33];
  char acStack_58 [32];
  undefined1 local_38;
  
  pcVar4 = acStack_58;
  pcVar2 = acStack_58;
  if (this->finalized == false) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "";
    pcVar2 = "";
  }
  else {
    lVar3 = 0;
    do {
      sprintf(pcVar4,"%02x",(ulong)this->digest[lVar3]);
      lVar3 = lVar3 + 1;
      pcVar4 = pcVar4 + 2;
    } while (lVar3 != 0x10);
    local_38 = 0;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = strlen(acStack_58);
    pcVar4 = acStack_58 + sVar1;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string MD5::hexdigest() const
{
  if (!finalized)
    return "";
 
  char buf[33];
  for (int i=0; i<16; i++)
    sprintf(buf+i*2, "%02x", digest[i]);
  buf[32]=0;
 
  return std::string(buf);
}